

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_map.h
# Opt level: O0

void __thiscall
bloaty::sourcemap::SourceMapObjectFile::SourceMapObjectFile
          (SourceMapObjectFile *this,
          unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *file_data,
          string *build_id)

{
  string *in_RDX;
  ObjectFile *in_RDI;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *in_stack_ffffffffffffffd0;
  
  std::unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>::unique_ptr
            ((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)in_RDI,
             (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)in_RDX);
  ObjectFile::ObjectFile
            (in_RDI,(unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)in_RDX
            );
  std::unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>::~unique_ptr
            (in_stack_ffffffffffffffd0);
  in_RDI->_vptr_ObjectFile = (_func_int **)&PTR__SourceMapObjectFile_00886d80;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  return;
}

Assistant:

SourceMapObjectFile(std::unique_ptr<InputFile> file_data,
                      std::string build_id)
    : ObjectFile(std::move(file_data)), build_id_(build_id) {}